

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electron.cpp
# Opt level: O3

Cycles __thiscall
Electron::ConcreteMachine<true>::perform_bus_operation
          (ConcreteMachine<true> *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  atomic_flag *paVar1;
  VideoOutput *pVVar2;
  uint8_t *puVar3;
  Tape *pTVar4;
  __atomic_flag_data_type _Var5;
  Typer *this_00;
  Plus3 *pPVar6;
  Observer *pOVar7;
  Interrupt IVar8;
  uint8_t uVar9;
  Range RVar10;
  uint uVar11;
  BusState BVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ssize_t sVar16;
  byte bVar17;
  _func_int **__n;
  ulong uVar18;
  char cVar19;
  undefined6 in_register_00000012;
  long lVar20;
  Cycles CVar21;
  uint __fd;
  int iVar22;
  int iVar23;
  WrappedInt<Cycles> cycles;
  bool bVar24;
  unique_ptr<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
  local_40;
  
  if (-1 < (short)address) {
    if ((int)operation < 5) {
      *value = this->ram_[address];
    }
    else {
      if ((((this->video_access_range_).low_address <= address) &&
          (address <= (this->video_access_range_).high_address)) &&
         ((this->video_).is_flushed_ == false)) {
        (this->video_).is_flushed_ = true;
        (this->video_).did_flush_ = true;
        CVar21.super_WrappedInt<Cycles>.length_ =
             (WrappedInt<Cycles>)(this->video_).time_since_update_.super_WrappedInt<Cycles>.length_;
        (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_ = 0;
        VideoOutput::run_for(&(this->video_).object_,CVar21);
      }
      this->ram_[address] = *value;
    }
    lVar20 = (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_;
    lVar14 = 0x7fffffff;
    if (lVar20 < 0x7fffffff) {
      lVar14 = lVar20;
    }
    iVar23 = -0x80000000;
    if (-0x80000000 < lVar14) {
      iVar23 = (int)lVar14;
    }
    uVar11 = VideoOutput::get_cycles_until_next_ram_availability(&(this->video_).object_,iVar23 + 1)
    ;
    iVar23 = uVar11 + 1;
    goto LAB_00329060;
  }
  __fd = (uint)(void *)CONCAT62(in_register_00000012,address);
  uVar11 = __fd & 0xff0f;
  if (0xf < uVar11 - 0xfe00) {
    switch(uVar11) {
    case 0xfc00:
      pPVar6 = (this->plus3_)._M_t.
               super___uniq_ptr_impl<Electron::Plus3,_std::default_delete<Electron::Plus3>_>._M_t.
               super__Tuple_impl<0UL,_Electron::Plus3_*,_std::default_delete<Electron::Plus3>_>.
               super__Head_base<0UL,_Electron::Plus3_*,_false>._M_head_impl;
      if ((__fd & 0xf0) == 0xc0 && pPVar6 != (Plus3 *)0x0) {
        if ((int)operation < 5) {
          *value = '\x01';
        }
        else {
          Plus3::set_control_register(pPVar6,*value);
        }
        goto LAB_00328fca;
      }
      iVar23 = 1;
      if ((__fd & 0xf0) != 0x40) goto LAB_00329060;
      this->scsi_acknowledge_ = true;
      if ((int)operation < 5) {
        BVar12 = SCSI::Bus::get_state(&this->scsi_bus_);
        *value = (uint8_t)BVar12;
      }
      else {
        this->scsi_data_ = *value;
      }
      break;
    case 0xfc01:
      iVar23 = 1;
      if (4 < (int)operation || (__fd & 0xf0) != 0x40) goto LAB_00329060;
      uVar11 = SCSI::Bus::get_state(&this->scsi_bus_);
      *value = (byte)(uVar11 >> 0x10) & 1 |
               (byte)(uVar11 >> 0xb) & 2 |
               (byte)(uVar11 >> 0xc) & 0x20 |
               (byte)(uVar11 >> 9) & 0x40 | (byte)(uVar11 >> 4) & 0x80 |
               (this->scsi_interrupt_mask_ & this->scsi_interrupt_state_) << 4;
      if ((this->scsi_select_ != true) ||
         (uVar11 = SCSI::Bus::get_state(&this->scsi_bus_), (uVar11 >> 0xc & 1) == 0))
      goto LAB_00329060;
      this->scsi_select_ = false;
      break;
    case 0xfc02:
      iVar23 = 1;
      if ((__fd & 0xf0) != 0x40) goto LAB_00329060;
      this->scsi_select_ = true;
      break;
    case 0xfc03:
      iVar23 = 1;
      if ((__fd & 0xf0) != 0x40) goto LAB_00329060;
      this->scsi_interrupt_state_ = false;
      this->scsi_interrupt_mask_ = (bool)(*value & 1);
      goto LAB_00329509;
    case 0xfc04:
    case 0xfc05:
    case 0xfc06:
    case 0xfc07:
      pPVar6 = (this->plus3_)._M_t.
               super___uniq_ptr_impl<Electron::Plus3,_std::default_delete<Electron::Plus3>_>._M_t.
               super__Tuple_impl<0UL,_Electron::Plus3_*,_std::default_delete<Electron::Plus3>_>.
               super__Head_base<0UL,_Electron::Plus3_*,_false>._M_head_impl;
      iVar23 = 1;
      bVar24 = (__fd & 0xf0) != 0xc0 || pPVar6 == (Plus3 *)0x0;
      uVar15 = (ulong)bVar24;
      if (bVar24) goto LAB_00329060;
      if ((address == 0xfcc4) && (this->is_holding_shift_ != false)) {
        this->is_holding_shift_ = false;
        this->key_states_[0xd] = this->key_states_[0xd] & 0xf7;
      }
      if (4 < (int)operation) {
        WD::WD1770::write(&pPVar6->super_WD1770,__fd,(void *)(ulong)*value,uVar15);
        goto LAB_00329060;
      }
      sVar16 = WD::WD1770::read(&pPVar6->super_WD1770,__fd,
                                (void *)CONCAT62(in_register_00000012,address),uVar15);
      uVar9 = (uint8_t)sVar16;
      goto LAB_00329266;
    default:
      goto switchD_00328f32_caseD_fe01;
    }
    iVar23 = 1;
    push_scsi_output(this);
    goto LAB_00329060;
  }
  __n = (_func_int **)
        ((long)&switchD_00328f32::switchdataD_004c47a4 +
        (long)(int)(&switchD_00328f32::switchdataD_004c47a4)[uVar11 - 0xfe00]);
  switch(uVar11) {
  case 0xfe00:
    if ((int)operation < 5) {
      bVar17 = this->interrupt_status_;
      *value = bVar17;
      this->interrupt_status_ = bVar17 & 0xfd;
    }
    else {
      this->interrupt_control_ = *value & 0xfe;
      evaluate_interrupts(this);
    }
    break;
  case 0xfe01:
switchD_00328f32_caseD_fe01:
    uVar11 = (uint)address;
    if (uVar11 < 0xc000) {
      iVar22 = this->active_rom_;
      if ((int)operation < 5) {
        bVar17 = this->roms_[iVar22][__fd & 0x3fff];
        *value = bVar17;
        if (this->keyboard_is_active_ == true) {
          bVar17 = bVar17 & 0xf0;
          *value = bVar17;
          lVar20 = 0;
          do {
            if ((__fd >> ((uint)lVar20 & 0x1f) & 1) == 0) {
              bVar17 = bVar17 | this->key_states_[lVar20];
              *value = bVar17;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0xe);
        }
        iVar23 = 1;
        if (this->basic_is_active_ == true) {
          *value = bVar17 & this->roms_[10][__fd & 0x3fff];
        }
      }
      else {
        iVar23 = 1;
        if (this->rom_write_masks_[iVar22] == true) {
          this->roms_[iVar22][__fd & 0x3fff] = *value;
        }
      }
      goto LAB_00329060;
    }
    iVar23 = 1;
    if (4 < (int)operation) goto LAB_00329060;
    if ((operation == ReadOpcode) && (this->use_fast_tape_hack_ != false)) {
      if (uVar11 < 0xf6de) {
        if (address - 0xf4e5 < 2) goto LAB_00329768;
        if (uVar11 == 0xf0a8) {
          if (((this->m6502_).super_ProcessorBase.super_ProcessorStorage.x_ == '\x0e') &&
             (this->ram_[0x247] == '\0')) {
            pTVar4 = &this->tape_;
            (this->tape_).delegate_ = (Delegate *)0x0;
            Tape::clear_interrupts(pTVar4,'\x10');
            iVar22 = -0x31;
            while( true ) {
              Storage::Tape::TapePlayer::get_tape(&pTVar4->super_TapePlayer);
              iVar13 = (**((Observer *)
                          local_40._M_t.
                          super___uniq_ptr_impl<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_Electron::VideoOutput_*,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                          .
                          super__Tuple_impl<1UL,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                          .
                          super__Head_base<1UL,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter,_false>
                          ._M_head_impl.actor_)->_vptr_Observer)();
              if (local_40._M_t.
                  super___uniq_ptr_impl<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_Electron::VideoOutput_*,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                  .super__Head_base<0UL,_Electron::VideoOutput_*,_false>._M_head_impl !=
                  (VideoOutput *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_40._M_t.
                           super___uniq_ptr_impl<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_Electron::VideoOutput_*,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                           .super__Head_base<0UL,_Electron::VideoOutput_*,_false>._M_head_impl);
              }
              if ((char)iVar13 != '\0') break;
              Storage::Tape::TapePlayer::run_for_input_pulse(&pTVar4->super_TapePlayer);
              if (iVar22 == 0) {
                this->fast_load_is_in_data_ = false;
              }
              if ((((this->tape_).interrupt_status_ & 0x10) != 0) &&
                 ((this->fast_load_is_in_data_ != false ||
                  (uVar9 = Tape::get_data_register(pTVar4), uVar9 == '*')))) break;
              iVar22 = iVar22 + 1;
            }
            (this->tape_).delegate_ = &this->super_Delegate;
            Tape::clear_interrupts(pTVar4,'\x10');
            this->interrupt_status_ = this->interrupt_status_ | (this->tape_).interrupt_status_;
            this->fast_load_is_in_data_ = true;
            (this->m6502_).super_ProcessorBase.super_ProcessorStorage.a_ = '\0';
            uVar9 = Tape::get_data_register(pTVar4);
            (this->m6502_).super_ProcessorBase.super_ProcessorStorage.y_ = uVar9;
            *value = '`';
            goto LAB_00329060;
          }
          uVar9 = this->os_[0x30a8];
          goto LAB_00329266;
        }
      }
      else if (((uVar11 - 0xf6de < 0x1e) && ((0x30000003U >> (uVar11 - 0xf6de & 0x1f) & 1) != 0)) ||
              (uVar11 - 0xfa51 < 2)) {
LAB_00329768:
        *value = 0xea;
        goto LAB_00329060;
      }
    }
    uVar9 = this->os_[__fd & 0x3fff];
LAB_00329266:
    iVar23 = 1;
    *value = uVar9;
    goto LAB_00329060;
  default:
    iVar23 = 1;
    if ((int)operation < 5) goto LAB_00329060;
    goto LAB_00328f43;
  case 0xfe04:
    pTVar4 = &this->tape_;
    if ((int)operation < 5) {
      uVar9 = Tape::get_data_register(pTVar4);
      *value = uVar9;
      uVar9 = '\x10';
    }
    else {
      Tape::set_data_register(pTVar4,*value);
      uVar9 = ' ';
    }
    Tape::clear_interrupts(pTVar4,uVar9);
    break;
  case 0xfe05:
    iVar23 = 1;
    if ((int)operation < 5) goto LAB_00329060;
    bVar17 = *value;
    if ((bVar17 & 0xf0) == 0) {
      this->active_rom_ = (uint)bVar17;
      bVar17 = *value;
      if ((bVar17 & 8) != 0) {
        if ((bVar17 & 4) == 0) {
          this->keyboard_is_active_ = (bVar17 & 2) == 0;
          this->basic_is_active_ = SUB41((bVar17 & 2) >> 1,0);
        }
        else {
          this->keyboard_is_active_ = false;
          this->basic_is_active_ = false;
        }
      }
      goto LAB_00329060;
    }
    if ((bVar17 & 0x10) != 0) {
      this->interrupt_status_ = this->interrupt_status_ & 0xfb;
    }
    if ((bVar17 & 0x20) != 0) {
      this->interrupt_status_ = this->interrupt_status_ & 0xf7;
    }
    if ((bVar17 & 0x40) != 0) {
      this->interrupt_status_ = this->interrupt_status_ & 0xbf;
    }
LAB_00329509:
    iVar23 = 1;
    evaluate_interrupts(this);
    goto LAB_00329060;
  case 0xfe06:
    iVar23 = 1;
    if (4 < (int)operation) {
      lVar20 = (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_;
      lVar14 = lVar20 + 7;
      if (-1 < lVar20) {
        lVar14 = lVar20;
      }
      (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = lVar20 % 8;
      Outputs::Speaker::PullLowpass<Electron::SoundGenerator>::run_for
                (&this->speaker_,&this->audio_queue_,(Cycles)(lVar14 >> 3));
      SoundGenerator::set_divider(&this->sound_generator_,*value);
      Tape::set_counter(&this->tape_,*value);
    }
    goto LAB_00329060;
  case 0xfe07:
    iVar23 = 1;
    if ((int)operation < 5) goto LAB_00329060;
    bVar17 = *value & 6;
    if (this->speaker_is_enabled_ != (bVar17 == 2)) {
      uVar15 = (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_;
      uVar18 = uVar15 + 7;
      if (-1 < (long)uVar15) {
        uVar18 = uVar15;
      }
      __n = (_func_int **)(uVar18 & 0xfffffffffffffff8);
      (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = (long)uVar15 % 8;
      Outputs::Speaker::PullLowpass<Electron::SoundGenerator>::run_for
                (&this->speaker_,&this->audio_queue_,(Cycles)((long)uVar18 >> 3));
      SoundGenerator::set_is_enabled(&this->sound_generator_,bVar17 == 2);
      this->speaker_is_enabled_ = bVar17 == 2;
      bVar17 = *value & 6;
    }
    (this->tape_).is_enabled_ = bVar17 != 6;
    Tape::set_is_in_input_mode(&this->tape_,(*value & 6) == 0);
    (this->tape_).is_running_ = (bool)(*value >> 6 & 1);
    bVar17 = *value;
    this->caps_led_state_ = (bool)(bVar17 >> 7);
    pOVar7 = this->activity_observer_;
    if (pOVar7 != (Observer *)0x0) {
      __n = pOVar7->_vptr_Observer;
      (*__n[4])(pOVar7,&this->caps_led,(ulong)(bVar17 >> 7));
    }
LAB_00328f43:
    LOCK();
    paVar1 = &(this->video_).flush_concurrency_check_;
    _Var5 = (paVar1->super___atomic_flag_base)._M_i;
    (paVar1->super___atomic_flag_base)._M_i = true;
    UNLOCK();
    if (_Var5 != false) {
      __assert_fail("!flush_concurrency_check_.test_and_set()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Electron/../../ClockReceiver/JustInTime.hpp"
                    ,0x7e,
                    "auto JustInTimeActor<Electron::VideoOutput, Cycles>::operator->() [T = Electron::VideoOutput, LocalTimeScale = Cycles, multiplier = 1, divider = 1]"
                   );
    }
    if ((this->video_).is_flushed_ == false) {
      (this->video_).is_flushed_ = true;
      (this->video_).did_flush_ = true;
      CVar21.super_WrappedInt<Cycles>.length_ =
           (WrappedInt<Cycles>)(this->video_).time_since_update_.super_WrappedInt<Cycles>.length_;
      (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_ = 0;
      VideoOutput::run_for(&(this->video_).object_,CVar21);
    }
    LOCK();
    (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    pVVar2 = &(this->video_).object_;
    local_40._M_t.
    super___uniq_ptr_impl<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Electron::VideoOutput_*,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter,_false>
            )&this->video_;
    local_40._M_t.
    super___uniq_ptr_impl<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Electron::VideoOutput_*,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
    .super__Head_base<0UL,_Electron::VideoOutput_*,_false>._M_head_impl = pVVar2;
    VideoOutput::write(pVVar2,__fd,(void *)(ulong)*value,(size_t)__n);
    std::
    unique_ptr<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr(&local_40);
    RVar10 = VideoOutput::get_memory_access_range(pVVar2);
    this->video_access_range_ = RVar10;
  }
LAB_00328fca:
  iVar23 = 1;
LAB_00329060:
  cycles.length_ = (IntType)iVar23;
  CVar21.super_WrappedInt<Cycles>.length_ =
       (WrappedInt<Cycles>)
       ((this->video_).time_since_update_.super_WrappedInt<Cycles>.length_ + cycles.length_);
  (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_ =
       (IntType)CVar21.super_WrappedInt<Cycles>.length_;
  (this->video_).is_flushed_ = false;
  lVar20 = (this->video_).time_until_event_.super_WrappedInt<Cycles>.length_;
  lVar14 = lVar20 - cycles.length_;
  (this->video_).time_until_event_.super_WrappedInt<Cycles>.length_ = lVar14;
  if (lVar14 == 0 || lVar20 < cycles.length_) {
    (this->video_).time_overrun_.super_WrappedInt<Cycles>.length_ = lVar14;
    (this->video_).is_flushed_ = true;
    (this->video_).did_flush_ = true;
    (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_ = 0;
    pVVar2 = &(this->video_).object_;
    VideoOutput::run_for(pVVar2,CVar21);
    JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::update_sequence_point(&this->video_);
    IVar8 = VideoOutput::get_interrupts(pVVar2);
    IVar8 = IVar8 | this->interrupt_status_;
    bVar24 = (this->interrupt_control_ & IVar8) != 0;
    this->interrupt_status_ = IVar8 & 0xfe | bVar24;
    cVar19 = '\0';
    if (this->scsi_interrupt_state_ != false) {
      cVar19 = this->scsi_interrupt_mask_;
    }
    (this->m6502_).super_ProcessorBase.super_ProcessorStorage.irq_line_ =
         (bVar24 || cVar19 != '\0') << 2;
  }
  uVar15 = (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ + cycles.length_;
  (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = uVar15;
  if (0x4000 < (long)uVar15) {
    (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = (ulong)((uint)uVar15 & 7);
    Outputs::Speaker::PullLowpass<Electron::SoundGenerator>::run_for
              (&this->speaker_,&this->audio_queue_,(Cycles)(uVar15 >> 3));
  }
  Tape::run_for(&this->tape_,(Cycles)cycles.length_);
  this_00 = (this->super_TypeRecipient<Electron::CharacterMapper>).typer_._M_t.
            super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
            super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
            super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
  if (this_00 != (Typer *)0x0) {
    Utility::Typer::run_for(this_00,(HalfCycles)(cycles.length_ * 2));
  }
  pPVar6 = (this->plus3_)._M_t.
           super___uniq_ptr_impl<Electron::Plus3,_std::default_delete<Electron::Plus3>_>._M_t.
           super__Tuple_impl<0UL,_Electron::Plus3_*,_std::default_delete<Electron::Plus3>_>.
           super__Head_base<0UL,_Electron::Plus3_*,_false>._M_head_impl;
  if (pPVar6 != (Plus3 *)0x0) {
    WD::WD1770::run_for(&pPVar6->super_WD1770,(Cycles)(long)(iVar23 * 4));
  }
  if ((this->shift_restart_counter_ != 0) &&
     (iVar23 = this->shift_restart_counter_ - iVar23, this->shift_restart_counter_ = iVar23,
     iVar23 < 1)) {
    this->shift_restart_counter_ = 0;
    puVar3 = &(this->m6502_).super_ProcessorBase.super_ProcessorStorage.interrupt_requests_;
    *puVar3 = *puVar3 | 0x10;
    this->key_states_[0xd] = this->key_states_[0xd] | 8;
    this->is_holding_shift_ = true;
  }
  if (this->scsi_is_clocked_ == true) {
    SCSI::Bus::run_for(&this->scsi_bus_,(HalfCycles)(cycles.length_ * 2));
  }
  return (Cycles)(WrappedInt<Cycles>)cycles.length_;
}

Assistant:

forceinline Cycles perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			unsigned int cycles = 1;

			if(address < 0x8000) {
				if(isReadOperation(operation)) {
					*value = ram_[address];
				} else {
					if(address >= video_access_range_.low_address && address <= video_access_range_.high_address) {
						video_.flush();
					}
					ram_[address] = *value;
				}

				// For the entire frame, RAM is accessible only on odd cycles; in modes below 4
				// it's also accessible only outside of the pixel regions.
				cycles += video_.last_valid()->get_cycles_until_next_ram_availability(video_.time_since_flush().template as<int>() + 1);
			} else {
				switch(address & 0xff0f) {
					case 0xfe00:
						if(isReadOperation(operation)) {
							*value = interrupt_status_;
							interrupt_status_ &= ~PowerOnReset;
						} else {
							interrupt_control_ = (*value) & ~1;
							evaluate_interrupts();
						}
					break;
					case 0xfe07:
						if(!isReadOperation(operation)) {
							// update speaker mode
							bool new_speaker_is_enabled = (*value & 6) == 2;
							if(new_speaker_is_enabled != speaker_is_enabled_) {
								update_audio();
								sound_generator_.set_is_enabled(new_speaker_is_enabled);
								speaker_is_enabled_ = new_speaker_is_enabled;
							}

							tape_.set_is_enabled((*value & 6) != 6);
							tape_.set_is_in_input_mode((*value & 6) == 0);
							tape_.set_is_running((*value & 0x40) ? true : false);

							caps_led_state_ = !!(*value & 0x80);
							if(activity_observer_)
								activity_observer_->set_led_status(caps_led, caps_led_state_);
						}

						[[fallthrough]];	// fe07 contains the display mode.


					case 0xfe02: case 0xfe03:
					case 0xfe08: case 0xfe09: case 0xfe0a: case 0xfe0b:
					case 0xfe0c: case 0xfe0d: case 0xfe0e: case 0xfe0f:
						if(!isReadOperation(operation)) {
							video_->write(address, *value);
							video_access_range_ = video_.last_valid()->get_memory_access_range();
						}
					break;
					case 0xfe04:
						if(isReadOperation(operation)) {
							*value = tape_.get_data_register();
							tape_.clear_interrupts(Interrupt::ReceiveDataFull);
						} else {
							tape_.set_data_register(*value);
							tape_.clear_interrupts(Interrupt::TransmitDataEmpty);
						}
					break;
					case 0xfe05:
						if(!isReadOperation(operation)) {
							const uint8_t interruptDisable = (*value)&0xf0;
							if( interruptDisable ) {
								if( interruptDisable&0x10 ) interrupt_status_ &= ~Interrupt::DisplayEnd;
								if( interruptDisable&0x20 ) interrupt_status_ &= ~Interrupt::RealTimeClock;
								if( interruptDisable&0x40 ) interrupt_status_ &= ~Interrupt::HighToneDetect;
								evaluate_interrupts();

								// TODO: NMI
							} else {
								// Latch the paged ROM in case external hardware is being emulated.
								active_rom_ = *value & 0xf;

								// apply the ULA's test
								if(*value & 0x08) {
									if(*value & 0x04) {
										keyboard_is_active_ = false;
										basic_is_active_ = false;
									} else {
										keyboard_is_active_ = !(*value & 0x02);
										basic_is_active_ = !keyboard_is_active_;
									}
								}
							}
						}
					break;
					case 0xfe06:
						if(!isReadOperation(operation)) {
							update_audio();
							sound_generator_.set_divider(*value);
							tape_.set_counter(*value);
						}
					break;

					case 0xfc04: case 0xfc05: case 0xfc06: case 0xfc07:
						if(plus3_ && (address&0x00f0) == 0x00c0) {
							if(is_holding_shift_ && address == 0xfcc4) {
								is_holding_shift_ = false;
								set_key_state(KeyShift, false);
							}
							if(isReadOperation(operation))
								*value = plus3_->read(address);
							else
								plus3_->write(address, *value);
						}
					break;
					case 0xfc00:
						if(plus3_ && (address&0x00f0) == 0x00c0) {
							if(!isReadOperation(operation)) {
								plus3_->set_control_register(*value);
							} else *value = 1;
						}

						if(has_scsi_bus && (address&0x00f0) == 0x0040) {
							scsi_acknowledge_ = true;
							if(!isReadOperation(operation)) {
								scsi_data_ = *value;
								push_scsi_output();
							} else {
								*value = SCSI::data_lines(scsi_bus_.get_state());
								push_scsi_output();
							}
						}
					break;
					case 0xfc03:
						if(has_scsi_bus && (address&0x00f0) == 0x0040) {
							scsi_interrupt_state_ = false;
							scsi_interrupt_mask_ = *value & 1;
							evaluate_interrupts();
						}
					break;
					case 0xfc01:
						if(has_scsi_bus && (address&0x00f0) == 0x0040 && isReadOperation(operation)) {
							// Status byte is:
							//
							//	b7:	SCSI C/D
							//	b6: SCSI I/O
							//	b5: SCSI REQ
							//	b4: interrupt flag
							//	b3:	0
							//	b2:	0
							//	b1:	SCSI BSY
							//	b0: SCSI MSG
							const auto state = scsi_bus_.get_state();
							*value =
								(state & SCSI::Line::Control ? 0x80 : 0x00) |
								(state & SCSI::Line::Input ? 0x40 : 0x00) |
								(state & SCSI::Line::Request ? 0x20 : 0x00) |
								((scsi_interrupt_state_ && scsi_interrupt_mask_) ? 0x10 : 0x00) |
								(state & SCSI::Line::Busy ? 0x02 : 0x00) |
								(state & SCSI::Line::Message ? 0x01 : 0x00);

							// Empirical guess: this is also the trigger to affect busy/request/acknowledge
							// signalling. Maybe?
							if(scsi_select_ && scsi_bus_.get_state() & SCSI::Line::Busy) {
								scsi_select_ = false;
								push_scsi_output();
							}
						}
					break;
					case 0xfc02:
						if(has_scsi_bus && (address&0x00f0) == 0x0040) {
							scsi_select_ = true;
							push_scsi_output();
						}
					break;

					// SCSI locations:
					//
					//	fc40:	data, read and write
					//	fc41:	status read
					//	fc42:	select write
					//	fc43:	interrupt latch
					//
					//
					// Interrupt latch is:
					//
					//	b0: enable or disable IRQ on REQ
					//	(and, possibly, writing to the latch acknowledges?)

					default:
						if(address >= 0xc000) {
							if(isReadOperation(operation)) {
								if(
									use_fast_tape_hack_ &&
									(operation == CPU::MOS6502::BusOperation::ReadOpcode) &&
									(
										(address == 0xf4e5) || (address == 0xf4e6) ||	// double NOPs at 0xf4e5, 0xf6de, 0xf6fa and 0xfa51
										(address == 0xf6de) || (address == 0xf6df) ||	// act to disable the normal branch into tape-handling
										(address == 0xf6fa) || (address == 0xf6fb) ||	// code, forcing the OS along the serially-accessed ROM
										(address == 0xfa51) || (address == 0xfa52) ||	// pathway.

										(address == 0xf0a8)								// 0xf0a8 is from where a service call would normally be
																						// dispatched; we can check whether it would be call 14
																						// (i.e. read byte) and, if so, whether the OS was about to
																						// issue a read byte call to a ROM despite the tape
																						// FS being selected. If so then this is a get byte that
																						// we should service synthetically. Put the byte into Y
																						// and set A to zero to report that action was taken, then
																						// allow the PC read to return an RTS.
									)
								) {
									const auto service_call = uint8_t(m6502_.value_of(CPU::MOS6502::Register::X));
									if(address == 0xf0a8) {
										if(!ram_[0x247] && service_call == 14) {
											tape_.set_delegate(nullptr);

											int cycles_left_while_plausibly_in_data = 50;
											tape_.clear_interrupts(Interrupt::ReceiveDataFull);
											while(!tape_.get_tape()->is_at_end()) {
												tape_.run_for_input_pulse();
												--cycles_left_while_plausibly_in_data;
												if(!cycles_left_while_plausibly_in_data) fast_load_is_in_data_ = false;
												if(	(tape_.get_interrupt_status() & Interrupt::ReceiveDataFull) &&
													(fast_load_is_in_data_ || tape_.get_data_register() == 0x2a)
												) break;
											}
											tape_.set_delegate(this);
											tape_.clear_interrupts(Interrupt::ReceiveDataFull);
											interrupt_status_ |= tape_.get_interrupt_status();

											fast_load_is_in_data_ = true;
											m6502_.set_value_of(CPU::MOS6502::Register::A, 0);
											m6502_.set_value_of(CPU::MOS6502::Register::Y, tape_.get_data_register());
											*value = 0x60; // 0x60 is RTS
										}
										else *value = os_[address & 16383];
									}
									else *value = 0xea;
								} else {
									*value = os_[address & 16383];
								}
							}
						} else {
							if(isReadOperation(operation)) {
								*value = roms_[active_rom_][address & 16383];
								if(keyboard_is_active_) {
									*value &= 0xf0;
									for(int address_line = 0; address_line < 14; address_line++) {
										if(!(address&(1 << address_line))) *value |= key_states_[address_line];
									}
								}
								if(basic_is_active_) {
									*value &= roms_[int(ROM::BASIC)][address & 16383];
								}
							} else if(rom_write_masks_[active_rom_]) {
								roms_[active_rom_][address & 16383] = *value;
							}
						}
					break;
				}
			}

			if(video_ += Cycles(int(cycles))) {
				signal_interrupt(video_.last_valid()->get_interrupts());
			}

			cycles_since_audio_update_ += Cycles(int(cycles));
			if(cycles_since_audio_update_ > Cycles(16384)) update_audio();
			tape_.run_for(Cycles(int(cycles)));

			if(typer_) typer_->run_for(Cycles(int(cycles)));
			if(plus3_) plus3_->run_for(Cycles(4*int(cycles)));
			if(shift_restart_counter_) {
				shift_restart_counter_ -= cycles;
				if(shift_restart_counter_ <= 0) {
					shift_restart_counter_ = 0;
					m6502_.set_power_on(true);
					set_key_state(KeyShift, true);
					is_holding_shift_ = true;
				}
			}

			if constexpr (has_scsi_bus) {
				if(scsi_is_clocked_) {
					scsi_bus_.run_for(Cycles(int(cycles)));
				}
			}

			return Cycles(int(cycles));
		}